

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::owning_iterator<std::forward_list<char,std::allocator<char>>>>,std::initializer_list<char>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::owning_iterator<std::forward_list<char,_std::allocator<char>_>_>_>
          *lhs,char *op,initializer_list<char> *rhs)

{
  ostream *poVar1;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  
  poVar1 = tlssPush();
  boost::operator<<(poVar1,(iterator_range<burst::owning_iterator<std::forward_list<char,_std::allocator<char>_>_>_>
                            *)this);
  tlssPop();
  String::String(&local_68,(char *)lhs);
  operator+(&local_38,&local_50,&local_68);
  poVar1 = tlssPush();
  test_detail::
  print_range<std::initializer_list<char>,test_detail::print_range<std::initializer_list<char>>(std::ostream&,std::initializer_list<char>const&)::_lambda(auto:1)_1_>
            (poVar1,op);
  tlssPop();
  operator+(__return_storage_ptr__,&local_38,&local_80);
  String::~String(&local_80);
  String::~String(&local_38);
  String::~String(&local_68);
  String::~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }